

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::DatePart::
PropagateDatePartStatistics<duckdb::date_t,duckdb::DatePart::YearWeekOperator,long>
          (DatePart *this,vector<duckdb::BaseStatistics,_true> *child_stats,LogicalType *stats_type)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  date_t input;
  date_t input_00;
  reference pvVar6;
  int32_t ww;
  BaseStatistics result;
  Value local_e0;
  LogicalType local_a0;
  BaseStatistics local_88;
  
  pvVar6 = vector<duckdb::BaseStatistics,_true>::operator[](child_stats,0);
  bVar5 = NumericStats::HasMinMax(pvVar6);
  if (bVar5) {
    input = NumericStats::GetMin<duckdb::date_t>(pvVar6);
    input_00 = NumericStats::GetMax<duckdb::date_t>(pvVar6);
    if (((input.days <= input_00.days) && (bVar5 = Value::IsFinite<duckdb::date_t>(input), bVar5))
       && (bVar5 = Value::IsFinite<duckdb::date_t>(input_00), bVar5)) {
      Date::ExtractISOYearWeek(input,(int32_t *)&local_88,(int32_t *)&local_e0);
      uVar4 = local_88.type._0_4_;
      uVar3 = local_e0.type_._0_4_;
      Date::ExtractISOYearWeek(input_00,(int32_t *)&local_88,(int32_t *)&local_e0);
      iVar1 = -local_e0.type_._0_4_;
      if (0 < (int)local_88.type._0_4_) {
        iVar1 = local_e0.type_._0_4_;
      }
      LogicalType::LogicalType(&local_a0,stats_type);
      NumericStats::CreateEmpty(&local_88,&local_a0);
      iVar2 = -uVar3;
      if (0 < (int)uVar4) {
        iVar2 = uVar3;
      }
      LogicalType::~LogicalType(&local_a0);
      Value::Value(&local_e0,(long)(uVar4 * 100 + iVar2));
      NumericStats::SetMin(&local_88,&local_e0);
      Value::~Value(&local_e0);
      Value::Value(&local_e0,(long)(iVar1 + local_88.type._0_4_ * 100));
      NumericStats::SetMax(&local_88,&local_e0);
      Value::~Value(&local_e0);
      pvVar6 = vector<duckdb::BaseStatistics,_true>::operator[](child_stats,0);
      BaseStatistics::CopyValidity(&local_88,pvVar6);
      BaseStatistics::ToUnique((BaseStatistics *)this);
      BaseStatistics::~BaseStatistics(&local_88);
      return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
             (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
    }
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateDatePartStatistics(vector<BaseStatistics> &child_stats,
	                                                              const LogicalType &stats_type = LogicalType::BIGINT) {
		// we can only propagate complex date part stats if the child has stats
		auto &nstats = child_stats[0];
		if (!NumericStats::HasMinMax(nstats)) {
			return nullptr;
		}
		// run the operator on both the min and the max, this gives us the [min, max] bound
		auto min = NumericStats::GetMin<T>(nstats);
		auto max = NumericStats::GetMax<T>(nstats);
		if (min > max) {
			return nullptr;
		}
		// Infinities prevent us from computing generic ranges
		if (!Value::IsFinite(min) || !Value::IsFinite(max)) {
			return nullptr;
		}
		TR min_part = OP::template Operation<T, TR>(min);
		TR max_part = OP::template Operation<T, TR>(max);
		auto result = NumericStats::CreateEmpty(stats_type);
		NumericStats::SetMin(result, Value(min_part));
		NumericStats::SetMax(result, Value(max_part));
		result.CopyValidity(child_stats[0]);
		return result.ToUnique();
	}